

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O2

Vec_Wrd_t * Bdc_SpfdDecomposeTest__(Vec_Int_t **pvWeights)

{
  word t;
  uint Entry;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Bdc_Ent_t *p;
  Vec_Wrd_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  uint *puVar6;
  ulong uVar7;
  abctime aVar8;
  ulong uVar9;
  int *piVar10;
  abctime aVar11;
  FILE *pFVar12;
  ulong uVar13;
  abctime time;
  abctime time_00;
  uint uVar14;
  uint i;
  uint i_00;
  Bdc_Ent_t *pBVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  Bdc_Ent_t *pBVar22;
  Bdc_Ent_t *local_d0;
  
  aVar5 = Abc_Clock();
  printf("Allocating %.2f MB of internal memory.\n",0x40b65a0bc0000000);
  p = (Bdc_Ent_t *)calloc(250000000,0x18);
  *(undefined4 *)p = 0xffffffff;
  *(undefined4 *)&p->field_0x4 = 0xffffffff;
  p->iNext = -1;
  p->iList = -1;
  p->Truth = 0xffffffffffffffff;
  p->iList = 0;
  for (uVar13 = 0; uVar13 < 6000000000; uVar13 = uVar13 + 0x18) {
    *(undefined4 *)((long)&p->iList + uVar13) = 0;
  }
  uVar14 = 1;
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,1);
  p_00 = Vec_WrdStart(250000000);
  p_01 = Vec_IntStart(250000000);
  p_00->nSize = 0;
  p_01->nSize = 0;
  p_02 = Vec_IntAlloc(10);
  Vec_IntPush(p_02,1);
  lVar17 = 0x1fffffff;
  pBVar22 = p;
  for (lVar21 = 0; local_d0 = pBVar22 + 1, lVar21 != 0x30; lVar21 = lVar21 + 8) {
    *(ulong *)local_d0 = (*(ulong *)local_d0 & 0xe0000000e0000000) + lVar17;
    t = *(word *)((long)Truths + lVar21);
    pBVar22[1].Truth = t;
    puVar6 = (uint *)Bdc_SpfdHashLookup(p,0xc000013,t);
    *puVar6 = uVar14;
    Vec_WrdPush(p_00,t);
    Vec_IntPush(p_01,0);
    lVar17 = lVar17 + 0x100000000;
    uVar14 = uVar14 + 1;
    pBVar22 = local_d0;
  }
  Vec_IntPush(p_02,7);
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,(ulong)uVar14);
  uVar14 = 0;
  do {
    if (uVar14 == 6) {
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x7bf12c,(char *)(aVar8 - aVar5),time_00);
      pFVar12 = fopen("func6v6n_bin.txt","wb");
      fwrite(p_00->pArray,8,(long)p_00->nSize,pFVar12);
      fclose(pFVar12);
      pFVar12 = fopen("func6v6nW_bin.txt","wb");
      fwrite(p_01->pArray,4,(long)p_01->nSize,pFVar12);
      fclose(pFVar12);
LAB_004773e0:
      Vec_IntFree(p_02);
      free(p);
      *pvWeights = p_01;
      return p_00;
    }
    Entry = uVar14 + 1;
    uVar13 = 0;
    while (i_00 = (uint)uVar13, i_00 != 6) {
      uVar7 = 0;
      while (i = (uint)uVar7, i != 6) {
        if (i < i_00 || uVar14 != i) {
          uVar7 = (ulong)(i + 1);
        }
        else {
          iVar1 = Vec_IntEntry(p_02,i_00);
          iVar2 = Vec_IntEntry(p_02,i_00 + 1);
          iVar3 = Vec_IntEntry(p_02,i);
          iVar4 = Vec_IntEntry(p_02,i + 1);
          aVar8 = Abc_Clock();
          printf("Trying %7d  x %7d.  ",((long)iVar2 * 0x18 + (long)iVar1 * -0x18) / 0x18,
                 ((long)iVar4 * 0x18 + (long)iVar3 * -0x18) / 0x18 & 0xffffffff);
          for (pBVar22 = p + iVar1; pBVar22 < p + iVar2; pBVar22 = pBVar22 + 1) {
            for (pBVar15 = p + iVar3; pBVar15 < p + iVar4; pBVar15 = pBVar15 + 1) {
              if ((i_00 < i) || (pBVar22 < pBVar15)) {
                iVar1 = 0;
                iVar16 = 0;
                for (uVar20 = 0; uVar20 != 5; uVar20 = uVar20 + 1) {
                  uVar9 = (long)(int)-(uVar20 & 1) ^ pBVar22->Truth;
                  uVar18 = (long)(iVar16 >> 0x1f) ^ pBVar15->Truth;
                  uVar19 = uVar18 & uVar9;
                  if (uVar20 == 4) {
                    uVar19 = uVar18 ^ uVar9;
                  }
                  uVar9 = -(ulong)((uint)uVar19 & 1);
                  if (uVar19 != uVar9) {
                    uVar9 = uVar9 ^ uVar19;
                    piVar10 = Bdc_SpfdHashLookup(p,0xc000013,uVar9);
                    if (piVar10 != (int *)0x0) {
                      local_d0->Truth = uVar9;
                      *(ulong *)local_d0 =
                           (ulong)(((uint)uVar19 & 1) << 0x1e) |
                           (ulong)(uVar20 >> 2) << 0x3e |
                           CONCAT44((int)(((long)pBVar15 - (long)p) / 0x18),iVar1) &
                           0x1fffffff20000000 | (ulong)(uVar20 >> 1 & 1) << 0x3d |
                           (*(ulong *)local_d0 & 0x8000000080000000) +
                           (ulong)((uint)(((long)pBVar22 - (long)p) / 0x18) & 0x1fffffff);
                      *piVar10 = (int)(((long)local_d0 - (long)p) / 0x18);
                      local_d0 = local_d0 + 1;
                      Vec_WrdPush(p_00,uVar9);
                      Vec_IntPush(p_01,Entry);
                      if ((long)local_d0 - (long)p == 6000000000) {
                        printf("Reached limit of %d functions.\n",250000000);
                        goto LAB_004773e0;
                      }
                    }
                  }
                  iVar16 = iVar16 + 0x40000000;
                  iVar1 = iVar1 + 0x20000000;
                }
              }
            }
          }
          printf("Added %d + %d + 1 = %d. Total = %8d.   ",uVar13,uVar7,(ulong)Entry,
                 ((long)local_d0 - (long)p) / 0x18 & 0xffffffff);
          aVar11 = Abc_Clock();
          Abc_PrintTime(0x7bf12c,(char *)(aVar11 - aVar8),time);
          uVar7 = (ulong)(i + 1);
        }
      }
      uVar14 = uVar14 - 1;
      uVar13 = (ulong)(i_00 + 1);
    }
    Vec_IntPush(p_02,(int)(((long)local_d0 - (long)p) / 0x18));
    uVar14 = Entry;
  } while( true );
}

Assistant:

Vec_Wrd_t * Bdc_SpfdDecomposeTest__( Vec_Int_t ** pvWeights )
{
//    int nFuncs = 8000000; // the number of functions to compute
//    int nSize  = 2777111; // the hash table size to use
//    int Limit  = 6;
    
//    int nFuncs = 51000000; // the number of functions to compute
//    int nSize  = 50331653; // the hash table size to use
//    int Limit  = 6;
    
    int nFuncs = 250000000; // the number of functions to compute
    int nSize  = 201326611; // the hash table size to use
    int Limit  = 6;

    int * pPlace, i, n, m, k, s, fCompl;
    abctime clk = Abc_Clock(), clk2;
    Vec_Int_t * vStops;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vWeights;
    Bdc_Ent_t * p, * q, * pBeg0, * pEnd0, * pBeg1, * pEnd1, * pThis0, * pThis1;
    word t0, t1, t;
    assert( nSize <= nFuncs );

    printf( "Allocating %.2f MB of internal memory.\n", 1.0*sizeof(Bdc_Ent_t)*nFuncs/(1<<20) );

    p = (Bdc_Ent_t *)calloc( nFuncs, sizeof(Bdc_Ent_t) );
    memset( p, 255, sizeof(Bdc_Ent_t) );
    p->iList = 0;
    for ( q = p; q < p+nFuncs; q++ )
       q->iList = 0;
    q = p + 1;
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    vTruths  = Vec_WrdStart( nFuncs );
    vWeights = Vec_IntStart( nFuncs );
    Vec_WrdClear( vTruths );
    Vec_IntClear( vWeights );

    // create elementary vars
    vStops = Vec_IntAlloc( 10 );
    Vec_IntPush( vStops, 1 );
    for ( i = 0; i < 6; i++ )
    {
        q->iFan0 = BDC_TERM;
        q->iFan1 = i;
        q->Truth = Truths[i];
        pPlace   = Bdc_SpfdHashLookup( p, nSize, q->Truth );
        *pPlace  = q-p;
        q++;
        Vec_WrdPush( vTruths, Truths[i] );
        Vec_IntPush( vWeights, 0 );
    }
    Vec_IntPush( vStops, 7 );
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    // create gates
    for ( n = 0; n < Limit; n++ )
    {
        // try previous
        for ( k = 0; k < Limit; k++ )
        for ( m = 0; m < Limit; m++ )
        {
            if ( k + m != n || k > m )
                continue;
            // set the start and stop
            pBeg0 = p + Vec_IntEntry( vStops, k );
            pEnd0 = p + Vec_IntEntry( vStops, k+1 );
            // set the start and stop
            pBeg1 = p + Vec_IntEntry( vStops, m );
            pEnd1 = p + Vec_IntEntry( vStops, m+1 );

            clk2 = Abc_Clock();
            printf( "Trying %7d  x %7d.  ", (int)(pEnd0-pBeg0), (int)(pEnd1-pBeg1) );
            for ( pThis0 = pBeg0; pThis0 < pEnd0; pThis0++ )
            for ( pThis1 = pBeg1; pThis1 < pEnd1; pThis1++ )
            if ( k < m || pThis1 > pThis0 )
//            if ( n < 5 || Bdc_SpfdCheckOverlap(p, pThis0, pThis1) )
            for ( s = 0; s < 5; s++ )
            {
                t0 = (s&1)      ? ~pThis0->Truth : pThis0->Truth;
                t1 = ((s>>1)&1) ? ~pThis1->Truth : pThis1->Truth;
                t  = ((s>>2)&1) ? t0 ^ t1 : t0 & t1;
                fCompl = t & 1;
                if ( fCompl )
                    t = ~t;
                if ( t == 0 )
                    continue;
                pPlace = Bdc_SpfdHashLookup( p, nSize, t );
                if ( pPlace == NULL )
                    continue;
                q->iFan0   = pThis0-p;
                q->fCompl0 = s&1;
                q->iFan1   = pThis1-p;
                q->fCompl1 = (s>>1)&1;
                q->fExor   = (s>>2)&1;
                q->Truth   = t;
                q->fCompl  = fCompl;
                *pPlace = q-p;
                q++;
                Vec_WrdPush( vTruths, t );
//                Vec_IntPush( vWeights, n == 5 ? n : n+1 );
                Vec_IntPush( vWeights, n+1 );
                if ( q-p == nFuncs )
                {
                    printf( "Reached limit of %d functions.\n", nFuncs );
                    goto finish;
                }
            }
            printf( "Added %d + %d + 1 = %d. Total = %8d.   ", k, m, n+1, (int)(q-p) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        Vec_IntPush( vStops, q-p );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );


    {
        FILE * pFile = fopen( "func6v6n_bin.txt", "wb" );
        fwrite( Vec_WrdArray(vTruths), sizeof(word), Vec_WrdSize(vTruths), pFile );
        fclose( pFile );
    }
    {
        FILE * pFile = fopen( "func6v6nW_bin.txt", "wb" );
        fwrite( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
        fclose( pFile );
    }


finish:
    Vec_IntFree( vStops );
    free( p );

    *pvWeights = vWeights;
//    Vec_WrdFree( vTruths );
    return vTruths;
}